

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O0

int publickey_response_success(LIBSSH2_PUBLICKEY *pkey)

{
  int iVar1;
  uint32_t uVar2;
  unsigned_long status;
  int rc;
  int response;
  size_t data_len;
  uchar *s;
  uchar *data;
  LIBSSH2_SESSION *session;
  LIBSSH2_PUBLICKEY *pkey_local;
  
  data = (uchar *)pkey->channel->session;
  session = (LIBSSH2_SESSION *)pkey;
  while( true ) {
    iVar1 = publickey_packet_receive((LIBSSH2_PUBLICKEY *)session,&s,(size_t *)&rc);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 != 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data,-0x1e,
                             "Timeout waiting for response from publickey subsystem");
      return iVar1;
    }
    if (_rc < 4) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data,-0x26,"Publickey response too small");
      return iVar1;
    }
    data_len = (size_t)s;
    iVar1 = publickey_response_id((uchar **)&data_len,_rc);
    if (iVar1 == 0) break;
    (**(code **)(data + 0x18))(s,data);
    if (iVar1 < 0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data,-0x24,"Invalid publickey subsystem response");
      return iVar1;
    }
    _libssh2_error((LIBSSH2_SESSION *)data,-0x24,"Unexpected publickey subsystem response");
    s = (uchar *)0x0;
  }
  if (_rc < 8) {
    iVar1 = _libssh2_error((LIBSSH2_SESSION *)data,-0x26,"Publickey response too small");
    return iVar1;
  }
  uVar2 = _libssh2_ntohu32((uchar *)data_len);
  (**(code **)(data + 0x18))(s,data);
  if ((ulong)uVar2 == 0) {
    return 0;
  }
  publickey_status_error((LIBSSH2_PUBLICKEY *)session,(LIBSSH2_SESSION *)data,(ulong)uVar2);
  return -1;
}

Assistant:

static int
publickey_response_success(LIBSSH2_PUBLICKEY * pkey)
{
    LIBSSH2_SESSION *session = pkey->channel->session;
    unsigned char *data, *s;
    size_t data_len;
    int response;

    for(;;) {
        int rc = publickey_packet_receive(pkey, &data, &data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                                  "Timeout waiting for response from "
                                  "publickey subsystem");
        }

        if(data_len < 4) {
            return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                  "Publickey response too small");
        }

        s = data;
        response = publickey_response_id(&s, data_len);

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status = 0;

            if(data_len < 8) {
                return _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                      "Publickey response too small");
            }

            status = _libssh2_ntohu32(s);

            LIBSSH2_FREE(session, data);

            if(status == LIBSSH2_PUBLICKEY_SUCCESS)
                return 0;

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        default:
            LIBSSH2_FREE(session, data);
            if(response < 0) {
                return _libssh2_error(session,
                                      LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                                      "Invalid publickey subsystem response");
            }
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            data = NULL;
        }
    }
err_exit:
    return -1;
}